

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::GenerateSerializationLoop
               (Formatter *format,bool string_key,bool string_value,bool is_deterministic)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  string ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if ((int)CONCAT71(in_register_00000009,is_deterministic) == 0) {
    Formatter::operator()<>
              (format,
               "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->_internal_$name$().begin();\n    it != this->_internal_$name$().end(); ++it) {\n"
              );
    pcVar2 = "it";
  }
  else {
    Formatter::operator()<>(format,"for (size_type i = 0; i < n; i++) {\n");
    pcVar2 = "items[static_cast<ptrdiff_t>(i)].second";
    if (string_key) {
      pcVar2 = "items[static_cast<ptrdiff_t>(i)]";
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_40,0,(char *)local_40._M_string_length,(ulong)pcVar2);
  io::Printer::Indent(format->printer_);
  Formatter::operator()
            (format,
             "target = $map_classname$::Funcs::InternalSerialize($number$, $1$->first, $1$->second, target, stream);\n"
             ,&local_40);
  if (string_key || string_value) {
    Formatter::operator()(format,"Utf8Check::Check(&(*$1$));\n",&local_40);
  }
  io::Printer::Outdent(format->printer_);
  Formatter::operator()<>(format,"}\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void GenerateSerializationLoop(const Formatter& format, bool string_key,
                                      bool string_value,
                                      bool is_deterministic) {
  std::string ptr;
  if (is_deterministic) {
    format("for (size_type i = 0; i < n; i++) {\n");
    ptr = string_key ? "items[static_cast<ptrdiff_t>(i)]"
                     : "items[static_cast<ptrdiff_t>(i)].second";
  } else {
    format(
        "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
        "    it = this->_internal_$name$().begin();\n"
        "    it != this->_internal_$name$().end(); ++it) {\n");
    ptr = "it";
  }
  format.Indent();

  format(
      "target = $map_classname$::Funcs::InternalSerialize($number$, "
      "$1$->first, $1$->second, target, stream);\n",
      ptr);

  if (string_key || string_value) {
    // ptr is either an actual pointer or an iterator, either way we can
    // create a pointer by taking the address after de-referencing it.
    format("Utf8Check::Check(&(*$1$));\n", ptr);
  }

  format.Outdent();
  format("}\n");
}